

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void dg::vr::RelationsAnalyzer::gepGen(ValueRelations *graph,GetElementPtrInst *gep)

{
  pointer ppVVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  GetElementPtrInst *gep_00;
  Relations *rels;
  VectorSet<const_llvm::Value_*> *pVVar6;
  pointer ppVVar7;
  GetElementPtrInst *gep_local;
  iterator it;
  GetElementPtrInst *otherGep;
  
  gep_local = gep;
  cVar2 = llvm::GetElementPtrInst::hasAllZeroIndices();
  if (cVar2 != '\0') {
    it.visited._M_t._M_impl._0_8_ = *(undefined8 *)(gep + -(ulong)(uint)(*(int *)(gep + 0x14) << 5))
    ;
    ValueRelations::setEqual<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (graph,&gep_local,(Value **)&it);
    gep = gep_local;
  }
  iVar4 = toChange(gep);
  gep_00 = ValueRelations::getInstance<llvm::GetElementPtrInst>
                     (graph,*(V *)(gep_local + -(ulong)(uint)(*(int *)(gep_local + 0x14) << 5)));
  if (gep_00 == (GetElementPtrInst *)0x0) {
LAB_00132bca:
    if (iVar4 == 0) goto LAB_00132bff;
  }
  else {
    iVar5 = toChange(gep_00);
    if (iVar4 != -iVar5 || (iVar5 == 0 || iVar4 == 0)) goto LAB_00132bca;
    it.visited._M_t._M_impl._0_8_ =
         *(undefined8 *)(gep_00 + -(ulong)(uint)(*(int *)(gep_00 + 0x14) << 5));
    ValueRelations::set<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (graph,&gep_local,EQ,(Value **)&it);
  }
  it.visited._M_t._M_impl._0_8_ =
       *(undefined8 *)(gep_local + -(ulong)(uint)(*(int *)(gep_local + 0x14) << 5));
  ValueRelations::set<llvm::Value_const*,llvm::GetElementPtrInst_const*>
            (graph,(Value **)&it,(uint)(iVar4 != 1) * 4 + SLT,&gep_local);
LAB_00132bff:
  otherGep = (GetElementPtrInst *)0x0;
  rels = Relations::pt((Relations *)&otherGep);
  ValueRelations::begin_buckets(&it,graph,rels);
  do {
    ValueRelations::end_buckets((iterator *)&otherGep,graph);
    bVar3 = operator!=(&it,(iterator *)&otherGep);
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator((iterator *)&otherGep);
    if (!bVar3) {
LAB_00132cb1:
      RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator(&it);
      return;
    }
    pVVar6 = ValueRelations::getEqual
                       (graph,it.edgeIt.stack.
                              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].current._from._M_data);
    ppVVar1 = (pVVar6->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar7 = (pVVar6->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar1;
        ppVVar7 = ppVVar7 + 1) {
      otherGep = (GetElementPtrInst *)*ppVVar7;
      if (((Value *)otherGep)[0x10] != (Value)0x3d) {
        otherGep = (GetElementPtrInst *)0x0;
      }
      if (otherGep != (GetElementPtrInst *)0x0) {
        bVar3 = operandsEqual(graph,(I)gep_local,(I)otherGep,true);
        if (bVar3) {
          ValueRelations::setEqual<llvm::GetElementPtrInst_const*,llvm::GetElementPtrInst_const*>
                    (graph,&gep_local,&otherGep);
          goto LAB_00132cb1;
        }
      }
    }
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator++(&it);
  } while( true );
}

Assistant:

void RelationsAnalyzer::gepGen(ValueRelations &graph,
                               const llvm::GetElementPtrInst *gep) {
    if (gep->hasAllZeroIndices())
        graph.setEqual(gep, gep->getPointerOperand());

    int thisChange = toChange(gep);
    if (const auto *origGep = graph.getInstance<llvm::GetElementPtrInst>(
                gep->getPointerOperand())) {
        int origChange = toChange(origGep);
        if (thisChange && origChange && thisChange + origChange == 0)
            graph.set(gep, Relations::EQ, origGep->getPointerOperand());
    }

    if (thisChange)
        graph.set(gep->getPointerOperand(),
                  thisChange == 1 ? Relations::SLT : Relations::SGT, gep);

    for (auto it = graph.begin_buckets(Relations().pt());
         it != graph.end_buckets(); ++it) {
        for (V from : graph.getEqual(it->from())) {
            if (const auto *otherGep =
                        llvm::dyn_cast<llvm::GetElementPtrInst>(from)) {
                if (operandsEqual(graph, gep, otherGep, true)) {
                    graph.setEqual(gep, otherGep);
                    return;
                }
            }
        }
    }
    // TODO something more?
    // indices method gives iterator over indices
}